

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::checkDependencies(CoreBroker *this)

{
  string_view searchValue;
  string_view str;
  bool bVar1;
  pointer pBVar2;
  string *psVar3;
  CoreBroker *this_00;
  reference pvVar4;
  size_type sVar5;
  pointer pBVar6;
  ActionMessage *this_01;
  CoreBroker *in_RDI;
  ActionMessage adddep_1;
  ActionMessage rmdep_2;
  GlobalFederateId *dep;
  iterator __end2_1;
  iterator __begin2_1;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *__range2_1;
  int localcnt;
  GlobalFederateId fedid;
  ActionMessage rmdep_1;
  ActionMessage rmdep;
  ActionMessage adddep;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> dependencies;
  value_type depid;
  ActionMessage logWarning;
  ActionMessage addDep;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  depfed;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>
  *newdep;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
  *__range2;
  ActionMessage *in_stack_fffffffffffff7d8;
  ActionMessage *in_stack_fffffffffffff7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e8;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
  *in_stack_fffffffffffff7f0;
  ActionMessage *in_stack_fffffffffffff7f8;
  action_t aVar7;
  GlobalFederateId in_stack_fffffffffffff800;
  undefined4 uVar8;
  GlobalFederateId in_stack_fffffffffffff804;
  undefined4 uVar9;
  CoreBroker *in_stack_fffffffffffff808;
  GlobalFederateId in_stack_fffffffffffff814;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff828;
  GlobalFederateId local_7b4;
  BaseType local_7b0;
  GlobalFederateId local_7ac;
  ActionMessage local_7a8;
  uint local_6ec;
  BaseType local_6e8;
  GlobalFederateId local_6e4;
  BaseType local_6e0;
  GlobalFederateId local_6dc [3];
  BaseType local_6d0;
  uint local_61c;
  BaseType local_618;
  GlobalFederateId local_614;
  uint local_610;
  BaseType local_60c;
  GlobalFederateId local_608;
  BaseType local_604;
  reference local_600;
  GlobalFederateId *local_5f8;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  local_5f0;
  undefined1 local_5e8 [24];
  undefined1 *local_5d0;
  int local_5c8;
  GlobalFederateId local_5c4;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> local_5c0;
  uint local_5a4;
  uint local_5a0;
  uint local_59c;
  BaseType local_598;
  GlobalFederateId local_594 [3];
  BaseType local_588;
  uint local_4d8;
  BaseType local_4d4;
  uint local_4d0;
  uint local_4cc;
  BaseType local_4c8;
  BaseType local_4c4;
  BaseType local_4c0;
  GlobalFederateId local_4bc;
  ActionMessage local_4b8;
  ActionMessage local_400;
  BaseType local_344;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> local_340;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> local_328 [28];
  GlobalFederateId local_30c;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> local_308;
  __sv_type local_2f0;
  BaseType local_29c;
  undefined4 local_298;
  GlobalFederateId local_294 [2];
  undefined4 local_28c;
  BaseType local_1d8;
  BaseType local_1d4;
  BaseType local_108;
  BaseType local_104;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [5];
  BasicFedInfo *local_48;
  __sv_type local_40;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_30;
  reference local_28;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>
  *local_20;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>_>
  local_18;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
  *local_10;
  
  if (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) {
    CLI::std::
    unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
    operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                *)0x51bace);
    BaseTimeCoordinator::getDependents((BaseTimeCoordinator *)in_RDI);
    sVar5 = std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::size
                      (&local_5c0);
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
              (in_stack_fffffffffffff7f0);
    if (sVar5 < 3) {
      GlobalFederateId::GlobalFederateId(&local_5c4);
      local_5c8 = 0;
      CLI::std::
      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
      operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  *)0x51bb3a);
      BaseTimeCoordinator::getDependents((BaseTimeCoordinator *)in_RDI);
      local_5d0 = local_5e8;
      local_5f0._M_current =
           (GlobalFederateId *)
           std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::begin
                     ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *
                      )in_stack_fffffffffffff7d8);
      local_5f8 = (GlobalFederateId *)
                  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
                  end((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *
                      )in_stack_fffffffffffff7d8);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                          ((__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                            *)in_stack_fffffffffffff7e0,
                           (__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                            *)in_stack_fffffffffffff7d8);
        aVar7 = (action_t)(sVar5 >> 0x20);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_600 = __gnu_cxx::
                    __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                    ::operator*(&local_5f0);
        local_604 = (in_RDI->super_BrokerBase).higher_broker_id.gid;
        bVar1 = GlobalFederateId::operator!=(local_600,(GlobalBrokerId)local_604);
        if (bVar1) {
          local_5c8 = local_5c8 + 1;
          local_5c4.gid = local_600->gid;
        }
        __gnu_cxx::
        __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
        ::operator++(&local_5f0);
      }
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
                (in_stack_fffffffffffff7f0);
      if (local_5c8 == 1) {
        pBVar6 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x51bc4a);
        local_60c = (in_RDI->super_BrokerBase).higher_broker_id.gid;
        GlobalFederateId::GlobalFederateId(&local_608,(GlobalBrokerId)local_60c);
        (*pBVar6->_vptr_BaseTimeCoordinator[6])(pBVar6,(ulong)(uint)local_608.gid);
        pBVar6 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x51bc92);
        local_610 = local_5c4.gid;
        (*pBVar6->_vptr_BaseTimeCoordinator[6])(pBVar6,(ulong)(uint)local_5c4.gid);
        this_01 = (ActionMessage *)
                  CLI::std::
                  unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                *)0x51bcbd);
        local_618 = (in_RDI->super_BrokerBase).higher_broker_id.gid;
        GlobalFederateId::GlobalFederateId(&local_614,(GlobalBrokerId)local_618);
        (**(code **)(*(long *)this_01 + 0x38))(this_01,local_614.gid);
        pBVar6 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x51bd07);
        local_61c = local_5c4.gid;
        (*pBVar6->_vptr_BaseTimeCoordinator[7])(pBVar6,(ulong)(uint)local_5c4.gid);
        ActionMessage::ActionMessage
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),aVar7);
        local_6e0 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
        GlobalFederateId::GlobalFederateId(local_6dc,(GlobalBrokerId)local_6e0);
        local_6d0 = local_6dc[0].gid;
        local_6e8 = (in_RDI->super_BrokerBase).higher_broker_id.gid;
        GlobalFederateId::GlobalFederateId(&local_6e4,(GlobalBrokerId)local_6e8);
        routeMessage(in_stack_fffffffffffff808,
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),
                     in_stack_fffffffffffff814);
        local_6ec = local_5c4.gid;
        routeMessage(in_stack_fffffffffffff808,
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),
                     in_stack_fffffffffffff814);
        ActionMessage::ActionMessage
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),aVar7);
        local_7a8.source_id.gid = local_5c4.gid;
        setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_7a8,child_flag);
        local_7b0 = (in_RDI->super_BrokerBase).higher_broker_id.gid;
        GlobalFederateId::GlobalFederateId(&local_7ac,(GlobalBrokerId)local_7b0);
        routeMessage(in_stack_fffffffffffff808,
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),
                     in_stack_fffffffffffff814);
        GlobalFederateId::GlobalFederateId
                  (&local_7b4,(GlobalBrokerId)(in_RDI->super_BrokerBase).higher_broker_id.gid);
        local_7a8.source_id.gid = local_7b4.gid;
        clearActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_7a8,child_flag);
        setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_7a8,parent_flag);
        routeMessage(in_stack_fffffffffffff808,
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),
                     in_stack_fffffffffffff814);
        ActionMessage::~ActionMessage(this_01);
        ActionMessage::~ActionMessage(this_01);
      }
    }
  }
  else {
    local_10 = &in_RDI->delayedDependencies;
    local_18._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>
          *)CLI::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
                     *)in_stack_fffffffffffff7d8);
    local_20 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>
                *)CLI::std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
                  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
                         *)in_stack_fffffffffffff7d8);
    while (bVar1 = __gnu_cxx::
                   operator==<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>_>
                             ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>_>
                               *)in_stack_fffffffffffff7e0,
                              (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>_>
                               *)in_stack_fffffffffffff7d8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_28 = __gnu_cxx::
                 __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>_>
                 ::operator*(&local_18);
      local_40 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff7e0);
      searchValue._M_len._4_4_ = in_stack_fffffffffffff804.gid;
      searchValue._M_len._0_4_ = in_stack_fffffffffffff800.gid;
      searchValue._M_str = (char *)in_stack_fffffffffffff808;
      local_30 = gmlc::containers::
                 DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                 ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                         *)in_stack_fffffffffffff7f8,searchValue);
      local_48 = (BasicFedInfo *)
                 gmlc::containers::
                 DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                 ::end((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                        *)in_stack_fffffffffffff7d8);
      bVar1 = __gnu_cxx::
              operator==<helics::BasicFedInfo_*,_const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                        ((__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                          *)in_stack_fffffffffffff7e0,
                         (__normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                          *)in_stack_fffffffffffff7d8);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_298 = 0;
        GlobalFederateId::GlobalFederateId(local_294,(GlobalBrokerId)0x0);
        local_29c = (local_28->second).gid;
        ActionMessage::ActionMessage
                  (in_stack_fffffffffffff7f8,(action_t)((ulong)in_stack_fffffffffffff7f0 >> 0x20),
                   in_stack_fffffffffffff804,in_stack_fffffffffffff800);
        local_28c = 3;
        std::operator+((char *)in_stack_fffffffffffff828,in_stack_fffffffffffff820);
        std::operator+(in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0);
        SmallBuffer::operator=
                  ((SmallBuffer *)in_stack_fffffffffffff808,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7e0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7e0);
        psVar3 = getIdentifier_abi_cxx11_(in_RDI);
        uVar8 = SUB84(psVar3,0);
        in_stack_fffffffffffff814.gid = (BaseType)((ulong)psVar3 >> 0x20);
        local_2f0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff7e0);
        str._M_str._0_4_ = uVar8;
        str._M_len = (size_t)in_stack_fffffffffffff808;
        str._M_str._4_4_ = in_stack_fffffffffffff814.gid;
        ActionMessage::setString
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),
                   (int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),str);
        routeMessage((CoreBroker *)
                     CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),
                     in_stack_fffffffffffff7f8);
        ActionMessage::~ActionMessage(in_stack_fffffffffffff7e0);
      }
      else {
        local_104 = (local_28->second).gid;
        pBVar2 = __gnu_cxx::
                 __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                 ::operator->(&local_30);
        local_108 = (pBVar2->global_id).gid;
        in_stack_fffffffffffff828 = local_100;
        ActionMessage::ActionMessage
                  (in_stack_fffffffffffff7f8,(action_t)((ulong)in_stack_fffffffffffff7f0 >> 0x20),
                   in_stack_fffffffffffff804,in_stack_fffffffffffff800);
        routeMessage((CoreBroker *)
                     CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),
                     in_stack_fffffffffffff7f8);
        pBVar2 = __gnu_cxx::
                 __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                 ::operator->(&local_30);
        local_1d4 = (pBVar2->global_id).gid;
        local_1d8 = (local_28->second).gid;
        ActionMessage::ActionMessage
                  (in_stack_fffffffffffff7f8,(action_t)((ulong)in_stack_fffffffffffff7f0 >> 0x20),
                   in_stack_fffffffffffff804,in_stack_fffffffffffff800);
        in_stack_fffffffffffff820 = local_100;
        ActionMessage::operator=(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
        ActionMessage::~ActionMessage(in_stack_fffffffffffff7e0);
        routeMessage((CoreBroker *)
                     CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),
                     in_stack_fffffffffffff7f8);
        ActionMessage::~ActionMessage(in_stack_fffffffffffff7e0);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>_>
      ::operator++(&local_18);
    }
    CLI::std::
    unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
    operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                *)0x51b63f);
    aVar7 = (action_t)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
    BaseTimeCoordinator::getDependents((BaseTimeCoordinator *)in_RDI);
    this_00 = (CoreBroker *)
              std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::size
                        (&local_308);
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
              (in_stack_fffffffffffff7f0);
    if (this_00 == (CoreBroker *)0x1) {
      CLI::std::
      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
      operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  *)0x51b692);
      BaseTimeCoordinator::getDependents((BaseTimeCoordinator *)in_RDI);
      pvVar4 = CLI::std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
               ::operator[](local_328,0);
      local_30c.gid = pvVar4->gid;
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
                (in_stack_fffffffffffff7f0);
      CLI::std::
      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
      operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  *)0x51b6de);
      BaseTimeCoordinator::getDependencies((BaseTimeCoordinator *)in_RDI);
      sVar5 = std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::size
                        (&local_340);
      if (sVar5 == 1) {
        pvVar4 = CLI::std::
                 vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::front
                           ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                             *)in_stack_fffffffffffff7e0);
        local_344 = local_30c.gid;
        bVar1 = GlobalFederateId::operator!=(pvVar4,local_30c);
        if (bVar1) {
          ActionMessage::ActionMessage
                    ((ActionMessage *)
                     CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),aVar7);
          local_400.source_id.gid = local_30c.gid;
          ActionMessage::ActionMessage
                    ((ActionMessage *)
                     CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),aVar7);
          local_4c0 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId(&local_4bc,(GlobalBrokerId)local_4c0);
          local_4b8.source_id.gid = local_4bc.gid;
          pvVar4 = CLI::std::
                   vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
                   front((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                          *)in_stack_fffffffffffff7e0);
          local_4c4 = pvVar4->gid;
          routeMessage(this_00,(ActionMessage *)
                               CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid)
                       ,in_stack_fffffffffffff814);
          pvVar4 = CLI::std::
                   vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
                   front((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                          *)in_stack_fffffffffffff7e0);
          local_4c8 = pvVar4->gid;
          routeMessage(this_00,(ActionMessage *)
                               CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid)
                       ,in_stack_fffffffffffff814);
          ActionMessage::setAction(&local_400,cmd_add_dependency);
          pvVar4 = CLI::std::
                   vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
                   front((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                          *)in_stack_fffffffffffff7e0);
          local_400.source_id.gid = pvVar4->gid;
          ActionMessage::setAction(&local_4b8,cmd_remove_dependency);
          local_4cc = local_30c.gid;
          routeMessage(this_00,(ActionMessage *)
                               CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid)
                       ,in_stack_fffffffffffff814);
          local_4d0 = local_30c.gid;
          routeMessage(this_00,(ActionMessage *)
                               CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid)
                       ,in_stack_fffffffffffff814);
          pBVar6 = CLI::std::
                   unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                 *)0x51b8a2);
          uVar8 = SUB84(pBVar6,0);
          uVar9 = (undefined4)((ulong)pBVar6 >> 0x20);
          pvVar4 = CLI::std::
                   vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
                   front((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                          *)in_stack_fffffffffffff7e0);
          local_4d4 = pvVar4->gid;
          (**(code **)(*(long *)CONCAT44(uVar9,uVar8) + 0x30))
                    ((long *)CONCAT44(uVar9,uVar8),local_4d4);
          pBVar6 = CLI::std::
                   unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                 *)0x51b8e5);
          local_4d8 = local_30c.gid;
          (*pBVar6->_vptr_BaseTimeCoordinator[7])(pBVar6,(ulong)(uint)local_30c.gid);
          ActionMessage::~ActionMessage(in_stack_fffffffffffff7e0);
          ActionMessage::~ActionMessage(in_stack_fffffffffffff7e0);
        }
        else {
          ActionMessage::ActionMessage
                    ((ActionMessage *)
                     CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid),aVar7);
          local_598 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId(local_594,(GlobalBrokerId)local_598);
          local_588 = local_594[0].gid;
          local_59c = local_30c.gid;
          routeMessage(this_00,(ActionMessage *)
                               CONCAT44(in_stack_fffffffffffff804.gid,in_stack_fffffffffffff800.gid)
                       ,in_stack_fffffffffffff814);
          pBVar6 = CLI::std::
                   unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                 *)0x51ba08);
          local_5a0 = local_30c.gid;
          (*pBVar6->_vptr_BaseTimeCoordinator[6])(pBVar6,(ulong)(uint)local_30c.gid);
          pBVar6 = CLI::std::
                   unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                 *)0x51ba3c);
          local_5a4 = local_30c.gid;
          (*pBVar6->_vptr_BaseTimeCoordinator[7])(pBVar6,(ulong)(uint)local_30c.gid);
          ActionMessage::~ActionMessage(in_stack_fffffffffffff7e0);
        }
      }
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
                (in_stack_fffffffffffff7f0);
    }
  }
  return;
}

Assistant:

void CoreBroker::checkDependencies()
{
    if (isRootc) {
        for (const auto& newdep : delayedDependencies) {
            auto depfed = mFederates.find(newdep.first);
            if (depfed != mFederates.end()) {
                ActionMessage addDep(CMD_ADD_DEPENDENCY, newdep.second, depfed->global_id);
                routeMessage(addDep);
                addDep = ActionMessage(CMD_ADD_DEPENDENT, depfed->global_id, newdep.second);
                routeMessage(addDep);
            } else {
                ActionMessage logWarning(CMD_LOG, parent_broker_id, newdep.second);
                logWarning.messageID = WARNING;
                logWarning.payload =
                    "unable to locate " + newdep.first + " to establish dependency";
                logWarning.setString(0, getIdentifier());
                routeMessage(logWarning);
            }
        }

        if (timeCoord->getDependents().size() == 1) {  // if there is just one dependency remove it
            auto depid{timeCoord->getDependents()[0]};
            auto dependencies = timeCoord->getDependencies();
            if (dependencies.size() == 1) {
                if (dependencies.front() != depid) {
                    ActionMessage adddep(CMD_ADD_DEPENDENT);
                    adddep.source_id = depid;
                    ActionMessage rmdep(CMD_REMOVE_DEPENDENT);
                    rmdep.source_id = global_broker_id_local;
                    routeMessage(adddep, dependencies.front());
                    routeMessage(rmdep, dependencies.front());

                    adddep.setAction(CMD_ADD_DEPENDENCY);
                    adddep.source_id = dependencies.front();
                    rmdep.setAction(CMD_REMOVE_DEPENDENCY);
                    routeMessage(adddep, depid);
                    routeMessage(rmdep, depid);

                    timeCoord->removeDependency(dependencies.front());
                    timeCoord->removeDependent(depid);
                } else {
                    ActionMessage rmdep(CMD_REMOVE_INTERDEPENDENCY);
                    rmdep.source_id = global_broker_id_local;

                    routeMessage(rmdep, depid);
                    timeCoord->removeDependency(depid);
                    timeCoord->removeDependent(depid);
                }
            }
        }
    } else {
        // if there is more than 2 dependents(higher broker + 2 or more other objects then we
        // need to be a timeCoordinator
        if (timeCoord->getDependents().size() > 2) {
            return;
        }

        GlobalFederateId fedid;
        int localcnt = 0;
        for (const auto& dep : timeCoord->getDependents()) {
            if (dep != higher_broker_id) {
                ++localcnt;
                fedid = dep;
            }
        }
        if (localcnt != 1) {
            return;
        }
        // remove the core from the time dependency chain
        timeCoord->removeDependency(higher_broker_id);
        timeCoord->removeDependency(fedid);
        timeCoord->removeDependent(higher_broker_id);
        timeCoord->removeDependent(fedid);

        ActionMessage rmdep(CMD_REMOVE_INTERDEPENDENCY);

        rmdep.source_id = global_broker_id_local;
        routeMessage(rmdep, higher_broker_id);
        routeMessage(rmdep, fedid);

        ActionMessage adddep(CMD_ADD_INTERDEPENDENCY);
        adddep.source_id = fedid;
        setActionFlag(adddep, child_flag);
        routeMessage(adddep, higher_broker_id);
        adddep.source_id = higher_broker_id;
        clearActionFlag(adddep, child_flag);
        setActionFlag(adddep, parent_flag);
        routeMessage(adddep, fedid);
    }
}